

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void free_abbrevs(backtrace_state *state,abbrevs *abbrevs,backtrace_error_callback error_callback,
                 void *data)

{
  ulong local_30;
  size_t i;
  void *data_local;
  backtrace_error_callback error_callback_local;
  abbrevs *abbrevs_local;
  backtrace_state *state_local;
  
  for (local_30 = 0; local_30 < abbrevs->num_abbrevs; local_30 = local_30 + 1) {
    tcmalloc_backtrace_free
              (state,abbrevs->abbrevs[local_30].attrs,abbrevs->abbrevs[local_30].num_attrs << 4,
               error_callback,data);
  }
  tcmalloc_backtrace_free(state,abbrevs->abbrevs,abbrevs->num_abbrevs << 5,error_callback,data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = (abbrev *)0x0;
  return;
}

Assistant:

static void
free_abbrevs (struct backtrace_state *state, struct abbrevs *abbrevs,
	      backtrace_error_callback error_callback, void *data)
{
  size_t i;

  for (i = 0; i < abbrevs->num_abbrevs; ++i)
    backtrace_free (state, abbrevs->abbrevs[i].attrs,
		    abbrevs->abbrevs[i].num_attrs * sizeof (struct attr),
		    error_callback, data);
  backtrace_free (state, abbrevs->abbrevs,
		  abbrevs->num_abbrevs * sizeof (struct abbrev),
		  error_callback, data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = NULL;
}